

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
duckdb::ChangeColumnTypeInfo::Deserialize(Deserializer *deserializer)

{
  char *tag;
  pointer pCVar1;
  pointer this;
  Deserializer *in_RSI;
  Deserializer *in_RDI;
  unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
  result;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
  *in_stack_ffffffffffffff90;
  Deserializer *ret;
  ChangeColumnTypeInfo *in_stack_ffffffffffffffa0;
  LogicalType *ret_00;
  Deserializer *this_00;
  field_id_t fVar2;
  _Head_base<0UL,_duckdb::AlterTableInfo_*,_false> ret_01;
  field_id_t in_stack_ffffffffffffffde;
  Deserializer *in_stack_ffffffffffffffe0;
  LogicalType local_18;
  
  ret_01._M_head_impl = (AlterTableInfo *)in_RDI;
  local_18.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)in_RSI;
  tag = (char *)operator_new(0xb8);
  ChangeColumnTypeInfo(in_stack_ffffffffffffffa0);
  ret_00 = &local_18;
  unique_ptr<duckdb::ChangeColumnTypeInfo,std::default_delete<duckdb::ChangeColumnTypeInfo>,true>::
  unique_ptr<std::default_delete<duckdb::ChangeColumnTypeInfo>,void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = (Deserializer *)
            local_18.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar1 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->(in_stack_ffffffffffffff90);
  fVar2 = (field_id_t)((ulong)pCVar1 >> 0x30);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde,tag,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ret_01._M_head_impl);
  ret = (Deserializer *)
        local_18.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar1 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->(in_stack_ffffffffffffff90);
  Deserializer::ReadProperty<duckdb::LogicalType>(in_RDI,fVar2,(char *)this_00,ret_00);
  fVar2 = (field_id_t)((ulong)ret_00 >> 0x30);
  this = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
         ::operator->(in_stack_ffffffffffffff90);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (this_00,fVar2,(char *)pCVar1,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)ret);
  unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>,true>::
  unique_ptr<duckdb::ChangeColumnTypeInfo,std::default_delete<std::unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>>>,void>
            ((unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
              *)this,(unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>_>
                      *)local_18.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                 *)0xae377c);
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (_Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>)
         ret_01._M_head_impl;
}

Assistant:

unique_ptr<AlterTableInfo> ChangeColumnTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ChangeColumnTypeInfo>(new ChangeColumnTypeInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	deserializer.ReadProperty<LogicalType>(401, "target_type", result->target_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(402, "expression", result->expression);
	return std::move(result);
}